

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O3

SmartPtr<AsyncEventAgent> * __thiscall
SmartPtr<AsyncEventAgent>::operator=(SmartPtr<AsyncEventAgent> *this,AsyncEventAgent *obj)

{
  int *piVar1;
  
  if (obj != (AsyncEventAgent *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
    piVar1 = &(obj->super_EventAgent).super_Event.super_RefCount.mRefCount;
    *piVar1 = *piVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  }
  if ((RefCount *)this->mObj != (RefCount *)0x0) {
    RefCount::Release((RefCount *)this->mObj);
  }
  this->mObj = obj;
  return this;
}

Assistant:

SmartPtr &operator=( T *obj )	
	{ 
		//printf( "SmartPtr = start\n" );
		if ( obj != NULL)
		{
			obj->AddRef();
		}

		if ( mObj != NULL )
			mObj->Release();
		mObj = obj;
		
		//printf( "SmartPtr = stop\n" );
		return *this;
	}